

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void tcache_arena_dissociate(tsdn_t *tsdn,tcache_slow_t *tcache_slow,tcache_t *tcache)

{
  cache_bin_array_descriptor_t *pcVar1;
  arena_t *arena;
  tcache_slow_t *ptVar2;
  tcache_slow_t *ptVar3;
  cache_bin_array_descriptor_t *pcVar4;
  cache_bin_array_descriptor_t *pcVar5;
  tcache_slow_t *ptVar6;
  cache_bin_array_descriptor_t *pcVar7;
  
  arena = tcache_slow->arena;
  malloc_mutex_lock(tsdn,&arena->tcache_ql_mtx);
  ptVar6 = (arena->tcache_ql).qlh_first;
  if (ptVar6 == tcache_slow) {
    ptVar6 = (ptVar6->link).qre_next;
    (arena->tcache_ql).qlh_first = ptVar6;
  }
  if (ptVar6 == tcache_slow) {
    (arena->tcache_ql).qlh_first = (tcache_slow_t *)0x0;
  }
  else {
    ptVar6 = (tcache_slow->link).qre_prev;
    ptVar2 = (((tcache_slow->link).qre_next)->link).qre_prev;
    (ptVar6->link).qre_next = ptVar2;
    ptVar3 = (tcache_slow->link).qre_next;
    (ptVar3->link).qre_prev = ptVar6;
    (tcache_slow->link).qre_prev = ptVar2;
    (((ptVar3->link).qre_prev)->link).qre_next = ptVar3;
    (ptVar2->link).qre_next = tcache_slow;
  }
  pcVar7 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  pcVar1 = &tcache_slow->cache_bin_array_descriptor;
  if (pcVar7 == pcVar1) {
    pcVar7 = (pcVar7->link).qre_next;
    (arena->cache_bin_array_descriptor_ql).qlh_first = pcVar7;
  }
  if (pcVar7 == pcVar1) {
    (arena->cache_bin_array_descriptor_ql).qlh_first = (cache_bin_array_descriptor_t *)0x0;
  }
  else {
    pcVar7 = (tcache_slow->cache_bin_array_descriptor).link.qre_prev;
    pcVar4 = (((tcache_slow->cache_bin_array_descriptor).link.qre_next)->link).qre_prev;
    (pcVar7->link).qre_next = pcVar4;
    pcVar5 = (tcache_slow->cache_bin_array_descriptor).link.qre_next;
    (pcVar5->link).qre_prev = pcVar7;
    (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar4;
    (((pcVar5->link).qre_prev)->link).qre_next = pcVar5;
    (pcVar4->link).qre_next = pcVar1;
  }
  duckdb_je_tcache_stats_merge(tsdn,tcache_slow->tcache,arena);
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48));
  tcache_slow->arena = (arena_t *)0x0;
  return;
}

Assistant:

static void
tcache_arena_dissociate(tsdn_t *tsdn, tcache_slow_t *tcache_slow,
    tcache_t *tcache) {
	arena_t *arena = tcache_slow->arena;
	assert(arena != NULL);
	if (config_stats) {
		/* Unlink from list of extant tcaches. */
		malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
		if (config_debug) {
			bool in_ql = false;
			tcache_slow_t *iter;
			ql_foreach(iter, &arena->tcache_ql, link) {
				if (iter == tcache_slow) {
					in_ql = true;
					break;
				}
			}
			assert(in_ql);
		}
		ql_remove(&arena->tcache_ql, tcache_slow, link);
		ql_remove(&arena->cache_bin_array_descriptor_ql,
		    &tcache_slow->cache_bin_array_descriptor, link);
		tcache_stats_merge(tsdn, tcache_slow->tcache, arena);
		malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);
	}
	tcache_slow->arena = NULL;
}